

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t *
Acb_FindSupportNext(sat_solver *pSat,int iFirstDiv,Vec_Int_t *vWeights,Vec_Wrd_t *vPats,int *pnPats)

{
  sat_solver *s;
  int iVar1;
  int Entry;
  int *begin;
  int *end;
  word *pwVar2;
  int iDivBest;
  word Mask [256];
  word *pMask;
  Vec_Int_t *vSupp;
  int local_40;
  int nDivs;
  int status;
  int i;
  int *pnPats_local;
  Vec_Wrd_t *vPats_local;
  Vec_Int_t *vWeights_local;
  sat_solver *psStack_18;
  int iFirstDiv_local;
  sat_solver *pSat_local;
  
  _status = pnPats;
  pnPats_local = &vPats->nCap;
  vPats_local = (Vec_Wrd_t *)vWeights;
  vWeights_local._4_4_ = iFirstDiv;
  psStack_18 = pSat;
  vSupp._4_4_ = Vec_IntSize(vWeights);
  pMask = (word *)Vec_IntAlloc(100);
  Abc_TtConst((word *)&stack0xfffffffffffff7a8,0x100,1);
  while( true ) {
    iVar1 = Acb_FindArgMaxUnderMask
                      ((Vec_Wrd_t *)pnPats_local,(word *)&stack0xfffffffffffff7a8,
                       (Vec_Int_t *)vPats_local,*_status);
    pwVar2 = pMask;
    Entry = Abc_Var2Lit(vWeights_local._4_4_ + iVar1,1);
    Vec_IntPush((Vec_Int_t *)pwVar2,Entry);
    Mask[0xff] = (word)Vec_WrdEntryP((Vec_Wrd_t *)pnPats_local,iVar1 << 8);
    Abc_TtAndSharp((word *)&stack0xfffffffffffff7a8,(word *)&stack0xfffffffffffff7a8,
                   (word *)Mask[0xff],0x100,1);
    s = psStack_18;
    begin = Vec_IntArray((Vec_Int_t *)pMask);
    end = Vec_IntLimit((Vec_Int_t *)pMask);
    local_40 = sat_solver_solve(s,begin,end,0,0,0,0);
    if (local_40 == -1) {
      Vec_IntSort((Vec_Int_t *)pMask,0);
      return (Vec_Int_t *)pMask;
    }
    if (local_40 != 1) break;
    local_40 = 1;
    for (nDivs = 0; nDivs < vSupp._4_4_; nDivs = nDivs + 1) {
      iVar1 = sat_solver_var_value(psStack_18,vWeights_local._4_4_ + nDivs);
      if (iVar1 != 0) {
        pwVar2 = Vec_WrdEntryP((Vec_Wrd_t *)pnPats_local,nDivs << 8);
        Abc_TtSetBit(pwVar2,*_status);
      }
    }
    *_status = *_status + 1;
    if (*_status == 0x4000) {
      printf("Exceeded %d words.\n",0x100);
      Vec_IntFreeP((Vec_Int_t **)&pMask);
      return (Vec_Int_t *)0x0;
    }
    if (0x3fff < *_status) {
      __assert_fail("*pnPats < NWORDS*64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                    ,0x3f7,
                    "Vec_Int_t *Acb_FindSupportNext(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int *)"
                   );
    }
  }
  __assert_fail("status == l_True",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                ,1000,
                "Vec_Int_t *Acb_FindSupportNext(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int *)"
               );
}

Assistant:

Vec_Int_t * Acb_FindSupportNext( sat_solver * pSat, int iFirstDiv, Vec_Int_t * vWeights, Vec_Wrd_t * vPats, int * pnPats )
{
    int i, status, nDivs = Vec_IntSize(vWeights);
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    word * pMask, Mask[NWORDS]; Abc_TtConst( Mask, NWORDS, 1 );
    while ( 1 )
    {
        int iDivBest = Acb_FindArgMaxUnderMask( vPats, Mask, vWeights, *pnPats ); 
        Vec_IntPush( vSupp, Abc_Var2Lit(iFirstDiv+iDivBest, 1) );
        //printf( "Selecting divisor %d with weight %d\n", iDivBest, Vec_IntEntry(vWeights, iDivBest) );
//        Mask &= ~Vec_WrdEntry( vPats, iDivBest );
        pMask = Vec_WrdEntryP( vPats, NWORDS*iDivBest );
        Abc_TtAndSharp( Mask, Mask, pMask, NWORDS, 1 );

        // try one run
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status == l_False )
            break;
        assert( status == l_True );
        // collect pattern
        for ( i = 0; i < nDivs; i++ )
        {
            if ( sat_solver_var_value(pSat, iFirstDiv+i) == 0 )
                continue;
            Abc_TtSetBit( Vec_WrdEntryP(vPats, NWORDS*i), *pnPats );
        }
        (*pnPats)++;
        if ( *pnPats == NWORDS*64 )
        {
            printf( "Exceeded %d words.\n", NWORDS );
            Vec_IntFreeP( &vSupp );
            return NULL;
        }
        assert( *pnPats < NWORDS*64 );
        //Acb_PrintPatterns( vPats, *pnPats, vWeights );
        //i = i;
    }
    Vec_IntSort( vSupp, 0 );
    return vSupp;
}